

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O2

void proto2_unittest::RecursiveMessage::SharedDtor(MessageLite *self)

{
  RecursiveMessage *this;
  ulong uVar1;
  LogMessageFatal LStack_18;
  
  google::protobuf::internal::InternalMetadata::Delete<std::__cxx11::string>
            (&self->_internal_metadata_);
  uVar1 = (self->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    google::protobuf::internal::ArenaStringPtr::Destroy
              ((ArenaStringPtr *)&self[1]._internal_metadata_);
    this = (RecursiveMessage *)self[2]._vptr_MessageLite;
    if (this != (RecursiveMessage *)0x0) {
      ~RecursiveMessage(this);
    }
    operator_delete(this,0x28);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&LStack_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest_lite.pb.cc"
             ,0x3345,"this_.GetArena() == nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_18);
}

Assistant:

inline void RecursiveMessage::SharedDtor(MessageLite& self) {
  RecursiveMessage& this_ = static_cast<RecursiveMessage&>(self);
  this_._internal_metadata_.Delete<std::string>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.payload_.Destroy();
  delete this_._impl_.recurse_;
  this_._impl_.~Impl_();
}